

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.hpp
# Opt level: O2

void __thiscall
Satyricon::Clause::Clause
          (Clause *this,bool l,vector<Satyricon::Literal,_std::allocator<Satyricon::Literal>_> *lits
          )

{
  pointer __src;
  double *pdVar1;
  size_t __n;
  uint uVar2;
  undefined7 in_register_00000031;
  
  uVar2 = (uint)CONCAT71(in_register_00000031,l);
  *(uint *)this = *(uint *)this & 0xfffffffe | uVar2;
  *(uint *)this =
       (uint)((ulong)((long)(lits->
                            super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(lits->
                           super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 1) & 0xfffffffe | uVar2;
  __src = (lits->super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>).
          _M_impl.super__Vector_impl_data._M_start;
  __n = (long)(lits->super__Vector_base<Satyricon::Literal,_std::allocator<Satyricon::Literal>_>).
              _M_impl.super__Vector_impl_data._M_finish - (long)__src;
  if (__n != 0) {
    memmove(this + 1,__src,__n);
  }
  if (l) {
    pdVar1 = get_activity(this);
    *pdVar1 = 1.0;
  }
  return;
}

Assistant:

Clause(bool l,const std::vector<Literal> &lits) :
        learned(l), _size(lits.size()) {
            std::copy(lits.begin(),lits.end(),this->begin());
            if ( learned ) get_activity() = 1.0;
        }